

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt> * __thiscall
pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
def_property_readonly<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
          (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *this,char *name,
          offset_in_Var_to_subr *fget)

{
  class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt> *pcVar1;
  void *local_38;
  cpp_function local_30;
  return_value_policy local_21;
  
  cpp_function::cpp_function<std::shared_ptr<kratos::ScopedStmtBlock>const&,kratos::IfStmt>
            (&local_30,*fget);
  local_21 = reference_internal;
  local_38 = (void *)0x0;
  pcVar1 = def_property<pybind11::cpp_function,decltype(nullptr),pybind11::return_value_policy>
                     (this,name,&local_30,&local_38,&local_21);
  object::~object((object *)&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }